

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# battlewithlandlord.cc
# Opt level: O2

bool BattleWithLandlord::GenCarry
               (map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_> *count
               ,uint len,int carry,
               vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
               *res)

{
  uint uVar1;
  pointer puVar2;
  bool bVar3;
  _Base_ptr p_Var4;
  pointer puVar5;
  vector<char,_std::allocator<char>_> v;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vi;
  multiset<char,_std::less<char>,_std::allocator<char>_> ms;
  _Vector_base<char,_std::allocator<char>_> local_98;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  uint local_60 [2];
  undefined4 local_58 [2];
  undefined8 local_50;
  undefined4 *local_48;
  undefined4 *local_40;
  undefined8 local_38;
  
  std::
  vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
  ::clear(res);
  if (carry == 1) {
    local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    for (p_Var4 = (count->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(count->_M_t)._M_impl.super__Rb_tree_header;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      if (*(int *)&p_Var4[1].field_0x4 != 0) {
        std::vector<char,_std::allocator<char>_>::push_back
                  ((vector<char,_std::allocator<char>_> *)&local_98,(value_type *)(p_Var4 + 1));
      }
    }
    if ((ulong)((long)local_98._M_impl.super__Vector_impl_data._M_finish -
               (long)local_98._M_impl.super__Vector_impl_data._M_start) < (ulong)len)
    goto LAB_0010c1e6;
    local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_78._M_impl.super__Vector_impl_data._M_start = (uint *)0x0;
    local_78._M_impl.super__Vector_impl_data._M_finish = (uint *)0x0;
    for (local_60[0] = 0; local_60[0] < len; local_60[0] = local_60[0] + 1) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78,local_60);
    }
    do {
      puVar2 = local_78._M_impl.super__Vector_impl_data._M_finish;
      local_58[0] = 0;
      local_50 = 0;
      local_38 = 0;
      local_48 = local_58;
      local_40 = local_58;
      for (puVar5 = local_78._M_impl.super__Vector_impl_data._M_start; puVar5 != puVar2;
          puVar5 = puVar5 + 1) {
        std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
        _M_insert_equal<char_const&>
                  ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>> *)
                   local_60,local_98._M_impl.super__Vector_impl_data._M_start + *puVar5);
      }
      std::
      vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
      ::push_back(res,(value_type *)local_60);
      std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
      ~_Rb_tree((_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                 *)local_60);
      bVar3 = next_combination<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_long>
                        ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          )local_78._M_impl.super__Vector_impl_data._M_start,
                         (long)local_78._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_78._M_impl.super__Vector_impl_data._M_start >> 2,
                         (long)local_98._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_98._M_impl.super__Vector_impl_data._M_start);
    } while (bVar3);
  }
  else {
    if (carry != 2) {
      return true;
    }
    local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    for (p_Var4 = (count->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(count->_M_t)._M_impl.super__Rb_tree_header;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      if (1 < *(int *)&p_Var4[1].field_0x4) {
        std::vector<char,_std::allocator<char>_>::push_back
                  ((vector<char,_std::allocator<char>_> *)&local_98,(value_type *)(p_Var4 + 1));
      }
    }
    if ((ulong)((long)local_98._M_impl.super__Vector_impl_data._M_finish -
               (long)local_98._M_impl.super__Vector_impl_data._M_start) < (ulong)len) {
LAB_0010c1e6:
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_98);
      return false;
    }
    local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_78._M_impl.super__Vector_impl_data._M_start = (uint *)0x0;
    local_78._M_impl.super__Vector_impl_data._M_finish = (uint *)0x0;
    for (local_60[0] = 0; local_60[0] < len; local_60[0] = local_60[0] + 1) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78,local_60);
    }
    do {
      puVar2 = local_78._M_impl.super__Vector_impl_data._M_finish;
      local_58[0] = 0;
      local_50 = 0;
      local_38 = 0;
      local_48 = local_58;
      local_40 = local_58;
      for (puVar5 = local_78._M_impl.super__Vector_impl_data._M_start; puVar5 != puVar2;
          puVar5 = puVar5 + 1) {
        uVar1 = *puVar5;
        std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
        _M_insert_equal<char_const&>
                  ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>> *)
                   local_60,local_98._M_impl.super__Vector_impl_data._M_start + uVar1);
        std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
        _M_insert_equal<char_const&>
                  ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>> *)
                   local_60,local_98._M_impl.super__Vector_impl_data._M_start + uVar1);
      }
      std::
      vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
      ::push_back(res,(value_type *)local_60);
      std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
      ~_Rb_tree((_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                 *)local_60);
      bVar3 = next_combination<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_long>
                        ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          )local_78._M_impl.super__Vector_impl_data._M_start,
                         (long)local_78._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_78._M_impl.super__Vector_impl_data._M_start >> 2,
                         (long)local_98._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_98._M_impl.super__Vector_impl_data._M_start);
    } while (bVar3);
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_78);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_98);
  return true;
}

Assistant:

bool BattleWithLandlord::GenCarry(const map<byte, int> &count, unsigned len, int carry, vector<multiset<byte> > &res) {
    res.clear();
    if (carry == 2) {
        vector<byte> v;
        for (auto &x: count) {
            if (x.second > 1) {
                v.push_back(x.first);
            }
        }
        if (v.size() < len) return false;
        vector<unsigned> vi;
        for (unsigned i = 0; i < len; ++i) {
            vi.push_back(i);
        }
        do {
            multiset<byte> ms;
            for (auto x: vi) {
                ms.insert(v[x]);
                ms.insert(v[x]);
            }
            res.push_back(ms);
        } while (next_combination(vi.begin(),vi.size(),v.size()));
    } else if (carry == 1) {
        vector<byte> v;
        for (auto &x: count) {
#ifdef DIFF_CARRY
            if (x.second)
                v.push_back(x.first);
#else
            for (int i = 0; i < x.second; ++i) {
                v.push_back(x.first);
            }
#endif
        }
        if (v.size() < len) return false;
        vector<unsigned> vi;
        for (unsigned i = 0; i < len; ++i) {
            vi.push_back(i);
        }
        do {
            multiset<byte> ms;
            for (auto x: vi) {
                ms.insert(v[x]);
            }
            res.push_back(ms);
        } while(next_combination(vi.begin(),vi.size(),v.size()));
        // bug remain, need to drop repeated items
        // fix it later
        // this is the reason why stl do not contain next_combination
    }
    return true;
}